

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int diff(int argc,char **argv)

{
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *other;
  PixelFormat PVar1;
  int iVar2;
  aligned_storage_t<sizeof(float),_alignof(float)> aVar3;
  bool bVar4;
  FILE *__stream;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Allocator AVar11;
  RGBColorSpace *this;
  RGBColorSpace *cs;
  memory_resource *pmVar12;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  ulong uVar15;
  size_t sVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  char *pcVar20;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_R9;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar21;
  Point2i p;
  undefined1 auVar22 [16];
  Float FVar23;
  float fVar24;
  undefined1 auVar25 [64];
  undefined1 in_XMM2 [16];
  span<int> out;
  string deltaString;
  long local_878;
  array<int,_4UL> cropWindow;
  undefined8 local_850;
  char **argv_local;
  Float refAverage;
  char *local_838;
  string metric;
  string imageFile;
  float delta;
  Float imageAverage;
  ImageChannelValues error;
  string local_7b8;
  string referenceFile;
  string local_778;
  undefined1 local_758 [72];
  ulong uStack_710;
  undefined8 uStack_708;
  undefined8 uStack_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined1 auStack_6d0 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_6c8;
  ulong uStack_6b8;
  undefined1 auStack_6b0 [8];
  optional<int> oStack_6a8;
  optional<float> oStack_6a0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_698;
  ulong uStack_690;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_688;
  string outFile;
  long *local_638 [2];
  long local_628 [2];
  undefined1 local_618 [16];
  code *local_608;
  code *local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  Image diffImage;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  ImageAndMetadata im;
  ImageAndMetadata refRead;
  ColorEncodingHandle local_40;
  ColorEncodingHandle local_38;
  
  outFile._M_dataplus._M_p = (pointer)&outFile.field_2;
  outFile._M_string_length = 0;
  outFile.field_2._M_local_buf[0] = '\0';
  imageFile._M_dataplus._M_p = (pointer)&imageFile.field_2;
  imageFile._M_string_length = 0;
  imageFile.field_2._M_local_buf[0] = '\0';
  referenceFile._M_dataplus._M_p = (pointer)&referenceFile.field_2;
  referenceFile._M_string_length = 0;
  referenceFile.field_2._M_local_buf[0] = '\0';
  metric._M_dataplus._M_p = (pointer)&metric.field_2;
  argv_local = argv;
  std::__cxx11::string::_M_construct<char_const*>((string *)&metric,"MSE","");
  cropWindow._M_elems[0] = -1;
  cropWindow._M_elems[1] = 0;
  cropWindow._M_elems[2] = -1;
  cropWindow._M_elems[3] = 0;
  if (*argv_local != (char *)0x0) {
    local_838 = "%s: unknown command flag";
    do {
      refRead.image._0_8_ = &refRead.image.channelNames;
      std::__cxx11::string::_M_construct<char_const*>((string *)&refRead,"outfile","");
      local_498 = (_Any_data)0x0;
      local_480 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                  ::_M_invoke;
      local_488 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                  ::_M_manager;
      bVar7 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,(string *)&refRead,&outFile,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_498);
      bVar9 = true;
      if (bVar7) {
LAB_001f1caf:
        bVar8 = false;
        bVar4 = false;
      }
      else {
        local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b8,"reference","");
        local_5d8 = (_Any_data)0x0;
        local_5c0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                    ::_M_invoke;
        local_5c8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                    ::_M_manager;
        bVar8 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,&local_7b8,&referenceFile,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_5d8);
        if (bVar8) goto LAB_001f1caf;
        local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"metric","");
        local_5f8 = (_Any_data)0x0;
        local_5e0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                    ::_M_invoke;
        local_5e8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                    ::_M_manager;
        bVar9 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,&local_778,&metric,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_5f8);
        if (bVar9) {
          bVar4 = true;
          bVar8 = false;
          bVar9 = true;
        }
        else {
          local_638[0] = local_628;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_638,"crop","");
          local_618 = (undefined1  [16])0x0;
          local_600 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                      ::_M_invoke;
          local_608 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:804:24)>
                      ::_M_manager;
          out.n = (size_t)local_618;
          out.ptr = (int *)0x4;
          bVar9 = pbrt::ParseArg<pstd::span<int>>
                            ((pbrt *)&argv_local,(char ***)local_638,(string *)&cropWindow,out,in_R9
                            );
          bVar8 = true;
          bVar4 = true;
        }
      }
      if (bVar8) {
        if (local_608 != (code *)0x0) {
          (*local_608)(local_618,local_618,3);
        }
        if (local_638[0] != local_628) {
          operator_delete(local_638[0],local_628[0] + 1);
        }
      }
      if (bVar4) {
        if (local_5e8 != (code *)0x0) {
          (*local_5e8)(&local_5f8,&local_5f8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_778._M_dataplus._M_p != &local_778.field_2) {
          operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
        }
      }
      if (!bVar7) {
        if (local_5c8 != (code *)0x0) {
          (*local_5c8)(&local_5d8,&local_5d8,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
          operator_delete(local_7b8._M_dataplus._M_p,local_7b8.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(&local_498,&local_498,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)refRead.image._0_8_ != &refRead.image.channelNames) {
        operator_delete((void *)refRead.image._0_8_,
                        (ulong)((long)&(refRead.image.channelNames.alloc.memoryResource)->
                                       _vptr_memory_resource + 1));
      }
      if (bVar9 == false) {
        pcVar20 = *argv_local;
        if (*pcVar20 == '-') {
LAB_001f3395:
          usage("diff",local_838,pcVar20);
        }
        if (imageFile._M_string_length != 0) {
          local_838 = "%s: excess argument";
          goto LAB_001f3395;
        }
        strlen(pcVar20);
        std::__cxx11::string::_M_replace((ulong)&imageFile,0,(char *)0x0,(ulong)pcVar20);
        argv_local = argv_local + 1;
      }
    } while (*argv_local != (char *)0x0);
  }
  if (imageFile._M_string_length == 0) {
    pcVar20 = "must specify image to compute difference with.";
LAB_001f33bb:
    usage("diff",pcVar20);
  }
  if (referenceFile._M_string_length == 0) {
    pcVar20 = "must specify --reference image";
    goto LAB_001f33bb;
  }
  iVar10 = std::__cxx11::string::compare((char *)&metric);
  if (iVar10 != 0) {
    iVar10 = std::__cxx11::string::compare((char *)&metric);
    if (iVar10 != 0) {
      iVar10 = std::__cxx11::string::compare((char *)&metric);
      if (iVar10 != 0) {
        usage("diff","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",metric._M_dataplus._M_p);
      }
    }
  }
  AVar11.memoryResource = pstd::pmr::new_delete_resource();
  local_38.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&refRead,&referenceFile,AVar11,&local_38);
  if (cropWindow._M_elems[1] < 0) {
    cropWindow._M_elems[1] = cropWindow._M_elems[0] - cropWindow._M_elems[1];
  }
  if (cropWindow._M_elems[3] < 0) {
    cropWindow._M_elems[3] = cropWindow._M_elems[2] - cropWindow._M_elems[3];
  }
  if ((-1 < cropWindow._M_elems[0]) && (-1 < cropWindow._M_elems[2])) {
    PVar1 = cropWindow._M_elems[0];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      PVar1 = cropWindow._M_elems[1];
    }
    iVar10 = cropWindow._M_elems[2];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar10 = cropWindow._M_elems[3];
    }
    diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar10;
    diffImage.format = PVar1;
    iVar10 = cropWindow._M_elems[1];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      iVar10 = cropWindow._M_elems[0];
    }
    iVar2 = cropWindow._M_elems[3];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar2 = cropWindow._M_elems[2];
    }
    diffImage._12_4_ = iVar2;
    diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = iVar10;
    AVar11.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Image::Crop(&im.image,&refRead.image,(Bounds2i *)&diffImage,AVar11);
    other = &im.image.channelNames;
    refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y =
         im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    refRead.image.format = im.image.format;
    refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x =
         im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&refRead.image.channelNames,other);
    refRead.image.encoding = im.image.encoding;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&refRead.image.p8,&im.image.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&refRead.image.p16,&im.image.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&refRead.image.p32,&im.image.p32);
    im.image.p32.nStored = 0;
    (*(im.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (im.image.p32.alloc.memoryResource,im.image.p32.ptr,im.image.p32.nAlloc << 2,4);
    im.image.p16.nStored = 0;
    (*(im.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (im.image.p16.alloc.memoryResource,im.image.p16.ptr,im.image.p16.nAlloc * 2,2);
    im.image.p8.nStored = 0;
    (*(im.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (im.image.p8.alloc.memoryResource,im.image.p8.ptr,im.image.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(other);
  }
  AVar11.memoryResource = pstd::pmr::new_delete_resource();
  local_40.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&im,&imageFile,AVar11,&local_40);
  if ((-1 < cropWindow._M_elems[0]) && (-1 < cropWindow._M_elems[2])) {
    aVar3 = (aligned_storage_t<sizeof(float),_alignof(float)>)cropWindow._M_elems[0];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      aVar3 = (aligned_storage_t<sizeof(float),_alignof(float)>)cropWindow._M_elems[1];
    }
    iVar10 = cropWindow._M_elems[2];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar10 = cropWindow._M_elems[3];
    }
    local_758._4_4_ = iVar10;
    local_758._0_4_ = aVar3;
    iVar10 = cropWindow._M_elems[1];
    if (cropWindow._M_elems[1] < cropWindow._M_elems[0]) {
      iVar10 = cropWindow._M_elems[0];
    }
    iVar2 = cropWindow._M_elems[3];
    if (cropWindow._M_elems[3] < cropWindow._M_elems[2]) {
      iVar2 = cropWindow._M_elems[2];
    }
    local_758._12_4_ = iVar2;
    local_758._8_4_ = iVar10;
    AVar11.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Image::Crop(&diffImage,&im.image,(Bounds2i *)local_758,AVar11);
    im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y =
         diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    im.image.format = diffImage.format;
    im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x =
         diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.x;
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&im.image.channelNames,&diffImage.channelNames);
    im.image.encoding = diffImage.encoding;
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
              (&im.image.p8,&diffImage.p8);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
              (&im.image.p16,&diffImage.p16);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&im.image.p32,&diffImage.p32);
    diffImage.p32.nStored = 0;
    (*(diffImage.p32.alloc.memoryResource)->_vptr_memory_resource[3])
              (diffImage.p32.alloc.memoryResource,diffImage.p32.ptr,diffImage.p32.nAlloc << 2,4);
    diffImage.p16.nStored = 0;
    (*(diffImage.p16.alloc.memoryResource)->_vptr_memory_resource[3])
              (diffImage.p16.alloc.memoryResource,diffImage.p16.ptr,diffImage.p16.nAlloc * 2,2);
    diffImage.p8.nStored = 0;
    (*(diffImage.p8.alloc.memoryResource)->_vptr_memory_resource[3])
              (diffImage.p8.alloc.memoryResource,diffImage.p8.ptr,diffImage.p8.nAlloc,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&diffImage.channelNames);
  }
  if ((im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x ==
       refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) &&
     (im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y ==
      refRead.image.resolution.super_Tuple2<pbrt::Point2,_int>.y)) {
    if ((int)im.image.channelNames.nStored == (int)refRead.image.channelNames.nStored) {
      pbrt::Image::ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&diffImage,&im.image);
      pbrt::Image::ChannelNames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_758,&refRead.image);
      if (diffImage._8_8_ - diffImage._0_8_ == local_758._8_8_ - local_758._0_8_) {
        bVar7 = std::__equal<false>::equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           diffImage._0_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           diffImage._8_8_,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_758._0_8_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_758);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&diffImage);
        if (!bVar7) goto LAB_001f3138;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_758);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&diffImage);
LAB_001f3138:
        _Var5._M_p = imageFile._M_dataplus._M_p;
        __stream = _stderr;
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&error,&im.image);
        diffImage._0_8_ = &diffImage.channelNames;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&diffImage,
                   (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                    alloc.memoryResource)->_vptr_memory_resource,
                   (long)error.
                         super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                         alloc.memoryResource[1]._vptr_memory_resource +
                   (long)(error.
                          super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                          alloc.memoryResource)->_vptr_memory_resource);
        if (0x20 < (ulong)((long)error.
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .ptr -
                          (long)error.
                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                .alloc.memoryResource)) {
          uVar15 = 1;
          lVar18 = 0x28;
          do {
            std::__cxx11::string::append((char *)&diffImage);
            std::__cxx11::string::_M_append
                      ((char *)&diffImage,
                       *(ulong *)((long)&error.
                                         super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                         .alloc.memoryResource[-1]._vptr_memory_resource + lVar18));
            uVar15 = uVar15 + 1;
            lVar18 = lVar18 + 0x20;
          } while (uVar15 < (ulong)((long)error.
                                          super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                          .ptr -
                                    (long)error.
                                          super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                          .alloc.memoryResource >> 5));
        }
        uVar6 = diffImage._0_8_;
        pbrt::Image::ChannelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&deltaString,&refRead.image);
        local_758._0_8_ = (long)local_758 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_758,*(long *)deltaString._M_dataplus._M_p,
                   *(long *)(deltaString._M_dataplus._M_p + 8) +
                   *(long *)deltaString._M_dataplus._M_p);
        if (0x20 < deltaString._M_string_length - (long)deltaString._M_dataplus._M_p) {
          uVar15 = 1;
          lVar18 = 0x28;
          do {
            std::__cxx11::string::append(local_758);
            std::__cxx11::string::_M_append
                      (local_758,*(ulong *)(deltaString._M_dataplus._M_p + lVar18 + -8));
            uVar15 = uVar15 + 1;
            lVar18 = lVar18 + 0x20;
          } while (uVar15 < (ulong)((long)(deltaString._M_string_length -
                                          (long)deltaString._M_dataplus._M_p) >> 5));
        }
        fprintf(__stream,
                "Warning: image channel names don\'t match: %s has \"%s\" but reference has \"%s\".\n"
                ,_Var5._M_p,uVar6,local_758._0_8_);
        if (local_758._0_8_ != (long)local_758 + 0x10) {
          operator_delete((void *)local_758._0_8_,(ulong)(local_758._16_8_ + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&deltaString);
        if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)diffImage._0_8_ != &diffImage.channelNames) {
          operator_delete((void *)diffImage._0_8_,
                          (ulong)((long)&(diffImage.channelNames.alloc.memoryResource)->
                                         _vptr_memory_resource + 1));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&error);
      }
      this = pbrt::ImageMetadata::GetColorSpace(&im.metadata);
      cs = pbrt::ImageMetadata::GetColorSpace(&refRead.metadata);
      bVar7 = pbrt::RGBColorSpace::operator!=(this,cs);
      if (bVar7) {
        diff();
      }
      if (im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y < 1) {
        uVar19 = 0;
        uVar17 = 0;
      }
      else {
        local_850 = 0;
        uVar17 = 0;
        uVar19 = 0;
        do {
          if (0 < im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
            local_838 = (char *)(local_850 << 0x20);
            uVar15 = 0;
            do {
              if (0 < (int)im.image.channelNames.nStored) {
                p.super_Tuple2<pbrt::Point2,_int> =
                     (Tuple2<pbrt::Point2,_int>)((ulong)local_838 | uVar15);
                iVar10 = 0;
                do {
                  FVar23 = pbrt::Image::GetChannel(&im.image,p,iVar10,(WrapMode2D)0x200000002);
                  if (ABS(FVar23) == INFINITY) {
                    pbrt::Image::SetChannel(&im.image,p,iVar10,0.0);
                    uVar19 = uVar19 + 1;
                  }
                  FVar23 = pbrt::Image::GetChannel(&refRead.image,p,iVar10,(WrapMode2D)0x200000002);
                  if (ABS(FVar23) == INFINITY) {
                    pbrt::Image::SetChannel(&refRead.image,p,iVar10,0.0);
                    uVar17 = uVar17 + 1;
                  }
                  iVar10 = iVar10 + 1;
                } while (iVar10 < (int)im.image.channelNames.nStored);
              }
              uVar15 = uVar15 + 1;
            } while ((long)uVar15 < (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_850 = local_850 + 1;
        } while ((long)local_850 < (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
      }
      if (0 < (int)uVar19) {
        fprintf(_stderr,"%s: clamped %d infinite pixel values.\n",imageFile._M_dataplus._M_p,
                (ulong)uVar19);
      }
      if (0 < (int)uVar17) {
        fprintf(_stderr,"%s: clamped %d infinite pixel values.\n",referenceFile._M_dataplus._M_p,
                (ulong)uVar17);
      }
      pmVar12 = pstd::pmr::new_delete_resource();
      diffImage.format = U256;
      diffImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
      diffImage._8_8_ = diffImage._8_8_ & 0xffffffff00000000;
      diffImage.channelNames.alloc.memoryResource = pstd::pmr::new_delete_resource();
      diffImage.channelNames.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      diffImage.channelNames.nAlloc = 0;
      diffImage.channelNames.nStored = 0;
      diffImage.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )0;
      diffImage.p8.ptr = (uchar *)0x0;
      diffImage.p8.nAlloc = 0;
      diffImage.p8.nStored = 0;
      diffImage.p16.ptr = (Half *)0x0;
      diffImage.p16.nAlloc = 0;
      diffImage.p16.nStored = 0;
      diffImage.p32.ptr = (float *)0x0;
      diffImage.p32.nAlloc = 0;
      diffImage.p32.nStored = 0;
      deltaString._M_dataplus._M_p = (pointer)((ulong)deltaString._M_dataplus._M_p._4_4_ << 0x20);
      diffImage.p8.alloc.memoryResource = pmVar12;
      diffImage.p16.alloc.memoryResource = pmVar12;
      diffImage.p32.alloc.memoryResource = pmVar12;
      local_758._0_8_ = pstd::pmr::new_delete_resource();
      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
                (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                 (long)(int)refRead.image.channelNames.nStored,(float *)&deltaString,
                 (polymorphic_allocator<float> *)local_758);
      iVar10 = std::__cxx11::string::compare((char *)&metric);
      if (iVar10 == 0) {
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
        pbrt::Image::L1Error
                  ((ImageChannelValues *)local_758,&im.image,(ImageChannelDesc *)&deltaString,
                   &refRead.image,&diffImage);
        pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                   (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_758);
        local_758._40_8_ = 0;
        (*(*(_func_int ***)local_758._0_8_)[3])
                  (local_758._0_8_,local_758._8_8_,local_758._32_8_ << 2,4);
        (**(code **)(*(long *)deltaString._M_dataplus._M_p + 0x18))
                  (deltaString._M_dataplus._M_p,deltaString._M_string_length,local_878 << 2,4);
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&metric);
        if (iVar10 == 0) {
          pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
          pbrt::Image::MSE((ImageChannelValues *)local_758,&im.image,
                           (ImageChannelDesc *)&deltaString,&refRead.image,&diffImage);
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_758)
          ;
          local_758._40_8_ = 0;
          (*(*(_func_int ***)local_758._0_8_)[3])
                    (local_758._0_8_,local_758._8_8_,local_758._32_8_ << 2,4);
          (**(code **)(*(long *)deltaString._M_dataplus._M_p + 0x18))
                    (deltaString._M_dataplus._M_p,deltaString._M_string_length,local_878 << 2,4);
        }
        else {
          pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
          pbrt::Image::MRSE((ImageChannelValues *)local_758,&im.image,
                            (ImageChannelDesc *)&deltaString,&refRead.image,&diffImage);
          pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                    (&error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>,
                     (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_758)
          ;
          local_758._40_8_ = 0;
          (*(*(_func_int ***)local_758._0_8_)[3])
                    (local_758._0_8_,local_758._8_8_,local_758._32_8_ << 2,4);
          (**(code **)(*(long *)deltaString._M_dataplus._M_p + 0x18))
                    (deltaString._M_dataplus._M_p,deltaString._M_string_length,local_878 << 2,4);
        }
      }
      paVar21 = &error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                 field_2;
      paVar13 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
      ;
      if (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr ==
          (float *)0x0) {
        paVar13 = paVar21;
      }
      auVar25 = ZEXT464((uint)paVar13->fixed[0]);
      if (1 < error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored)
      {
        sVar16 = 1;
        do {
          auVar22 = vmaxss_avx(ZEXT416((uint)paVar13->fixed[sVar16]),auVar25._0_16_);
          auVar25 = ZEXT1664(auVar22);
          sVar16 = sVar16 + 1;
        } while (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                 nStored != sVar16);
      }
      iVar10 = 0;
      if ((auVar25._0_4_ != 0.0) || (NAN(auVar25._0_4_))) {
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&refRead.image);
        pbrt::Image::Average
                  ((ImageChannelValues *)local_758,&refRead.image,(ImageChannelDesc *)&deltaString);
        uVar6 = local_758._40_8_;
        if (local_758._40_8_ == 0) {
          fVar24 = 0.0;
        }
        else {
          TVar14 = (Tuple2<pbrt::Point2,_int>)local_758._8_8_;
          if ((Tuple2<pbrt::Point2,_int>)local_758._8_8_ == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar14 = (Tuple2<pbrt::Point2,_int>)((long)local_758 + 0x10);
          }
          fVar24 = 0.0;
          sVar16 = 0;
          do {
            fVar24 = fVar24 + *(float *)((long)TVar14 + sVar16 * 4);
            sVar16 = sVar16 + 1;
          } while (local_758._40_8_ != sVar16);
        }
        local_758._40_8_ = 0;
        (*(*(_func_int ***)local_758._0_8_)[3])
                  (local_758._0_8_,local_758._8_8_,local_758._32_8_ << 2,4);
        (**(code **)(*(long *)deltaString._M_dataplus._M_p + 0x18))
                  (deltaString._M_dataplus._M_p,deltaString._M_string_length,local_878 << 2,4);
        auVar22 = vcvtusi2ss_avx512f(in_XMM2,uVar6);
        refAverage = fVar24 / auVar22._0_4_;
        pbrt::Image::AllChannelsDesc((ImageChannelDesc *)&deltaString,&im.image);
        pbrt::Image::Average
                  ((ImageChannelValues *)local_758,&im.image,(ImageChannelDesc *)&deltaString);
        uVar6 = local_758._40_8_;
        if (local_758._40_8_ == 0) {
          fVar24 = 0.0;
        }
        else {
          TVar14 = (Tuple2<pbrt::Point2,_int>)local_758._8_8_;
          if ((Tuple2<pbrt::Point2,_int>)local_758._8_8_ == (Tuple2<pbrt::Point2,_int>)0x0) {
            TVar14 = (Tuple2<pbrt::Point2,_int>)((long)local_758 + 0x10);
          }
          fVar24 = 0.0;
          sVar16 = 0;
          do {
            fVar24 = fVar24 + *(float *)((long)TVar14 + sVar16 * 4);
            sVar16 = sVar16 + 1;
          } while (local_758._40_8_ != sVar16);
        }
        local_758._40_8_ = 0;
        (*(*(_func_int ***)local_758._0_8_)[3])
                  (local_758._0_8_,local_758._8_8_,local_758._32_8_ << 2,4);
        (**(code **)(*(long *)deltaString._M_dataplus._M_p + 0x18))
                  (deltaString._M_dataplus._M_p,deltaString._M_string_length,local_878 << 2,4);
        auVar22 = vcvtusi2ss_avx512f(in_XMM2,uVar6);
        imageAverage = fVar24 / auVar22._0_4_;
        delta = ((imageAverage - refAverage) * 100.0) / refAverage;
        deltaString._M_string_length = 0;
        deltaString.field_2._M_local_buf[0] = '\0';
        deltaString._M_dataplus._M_p = (pointer)&deltaString.field_2;
        pbrt::detail::stringPrintfRecursive<float&>(&deltaString,"%f%% delta",&delta);
        auVar22._8_4_ = 0x7fffffff;
        auVar22._0_8_ = 0x7fffffff7fffffff;
        auVar22._12_4_ = 0x7fffffff;
        auVar22 = vandps_avx512vl(ZEXT416((uint)delta),auVar22);
        if (auVar22._0_4_ <= 0.1) {
          if (0.001 < auVar22._0_4_) {
            pbrt::Yellow((string *)local_758,&deltaString);
            goto LAB_001f2af7;
          }
        }
        else {
          pbrt::Red((string *)local_758,&deltaString);
LAB_001f2af7:
          std::__cxx11::string::operator=((string *)&deltaString,(string *)local_758);
          if (local_758._0_8_ != (long)local_758 + 0x10) {
            operator_delete((void *)local_758._0_8_,(ulong)(local_758._16_8_ + 1));
          }
        }
        if (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored ==
            0) {
          fVar24 = 0.0;
        }
        else {
          if (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr !=
              (float *)0x0) {
            paVar21 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                       *)error.
                         super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
            ;
          }
          fVar24 = 0.0;
          sVar16 = 0;
          do {
            fVar24 = fVar24 + paVar21->fixed[sVar16];
            sVar16 = sVar16 + 1;
          } while (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                   nStored != sVar16);
        }
        auVar22 = vcvtusi2ss_avx512f(in_XMM2,error.
                                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                             .nStored);
        local_758._0_4_ = fVar24 / auVar22._0_4_;
        pbrt::
        Printf<std::__cxx11::string&,std::__cxx11::string&,float&,float&,std::__cxx11::string&,std::__cxx11::string&,float>
                  ("Images differ:\n\t%s %s\n\tavg = %f / %f (%s), %s = %f\n",&imageFile,
                   &referenceFile,&imageAverage,&refAverage,&deltaString,&metric,(float *)local_758)
        ;
        if (outFile._M_string_length != 0) {
          _Stack_688._M_impl.super__Rb_tree_header._M_header._M_left =
               &_Stack_688._M_impl.super__Rb_tree_header._M_header;
          local_698 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                       )0x0;
          uStack_690 = 0;
          _Stack_688._M_impl._0_8_ = 0;
          _Stack_688._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          _Stack_688._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          _Stack_688._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_6d8 = 0;
          auStack_6d0 = (undefined1  [8])0x0;
          aStack_6c8._0_8_ = 0;
          aStack_6c8._8_8_ = 0;
          uStack_6b8 = 0;
          auStack_6b0 = (undefined1  [8])0x0;
          oStack_6a8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          oStack_6a8.set = false;
          oStack_6a8._5_3_ = 0;
          oStack_6a0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          oStack_6a0.set = false;
          oStack_6a0._5_3_ = 0;
          local_758._64_8_ = 0;
          uStack_710 = 0;
          uStack_708 = 0;
          uStack_700 = 0;
          uStack_6f8 = 0;
          uStack_6f0 = 0;
          uStack_6e8 = 0;
          uStack_6e0 = 0;
          local_758._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_758[4] = false;
          local_758._5_3_ = 0;
          local_758._8_4_ = 0;
          local_758._12_4_ = 0;
          local_758._16_8_ = (pointer)0x0;
          local_758._24_8_ = 0;
          local_758._32_8_ = 0;
          local_758._40_8_ = 0;
          local_758._48_8_ = 0;
          local_758._56_8_ = 0;
          _Stack_688._M_impl.super__Rb_tree_header._M_node_count = 0;
          _Stack_688._M_impl.super__Rb_tree_header._M_header._M_right =
               _Stack_688._M_impl.super__Rb_tree_header._M_header._M_left;
          pbrt::Image::Write(&diffImage,&outFile,(ImageMetadata *)local_758);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::~_Rb_tree(&_Stack_688);
          if (uStack_690._0_1_ == true) {
            uStack_690 = uStack_690 & 0xffffffffffffff00;
          }
          if (oStack_6a0.set == true) {
            oStack_6a0.set = false;
          }
          if (oStack_6a8.set == true) {
            oStack_6a8.set = false;
          }
          if ((bool)auStack_6b0[4] == true) {
            auStack_6b0[4] = 0;
          }
          if (uStack_6b8._0_1_ == true) {
            uStack_6b8 = uStack_6b8 & 0xffffffffffffff00;
          }
          if ((bool)auStack_6d0[4] == true) {
            auStack_6d0[4] = 0;
          }
          if (uStack_710._0_1_ == true) {
            uStack_710 = uStack_710 & 0xffffffffffffff00;
          }
          if ((bool)local_758[4] == true) {
            local_758[4] = 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)deltaString._M_dataplus._M_p != &deltaString.field_2) {
          operator_delete(deltaString._M_dataplus._M_p,
                          CONCAT71(deltaString.field_2._M_allocated_capacity._1_7_,
                                   deltaString.field_2._M_local_buf[0]) + 1);
        }
        iVar10 = 1;
      }
      error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored = 0;
      (*(error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
        memoryResource)->_vptr_memory_resource[3])
                (error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc
                 .memoryResource,
                 error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr,
                 error.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                 nAlloc << 2,4);
      diffImage.p32.nStored = 0;
      (*(diffImage.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                (diffImage.p32.alloc.memoryResource,diffImage.p32.ptr,diffImage.p32.nAlloc << 2,4);
      diffImage.p16.nStored = 0;
      (*(diffImage.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                (diffImage.p16.alloc.memoryResource,diffImage.p16.ptr,diffImage.p16.nAlloc * 2,2);
      diffImage.p8.nStored = 0;
      (*(diffImage.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                (diffImage.p8.alloc.memoryResource,diffImage.p8.ptr,diffImage.p8.nAlloc,1);
      pbrt::
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector(&diffImage.channelNames);
      goto LAB_001f2da9;
    }
    fprintf(_stderr,"%s: image channel count %d doesn\'t match reference %d.\n",
            imageFile._M_dataplus._M_p);
  }
  else {
    fprintf(_stderr,"%s: image resolution (%d, %d) doesn\'t match reference (%d, %d)\n",
            imageFile._M_dataplus._M_p);
  }
  iVar10 = 1;
LAB_001f2da9:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&im.metadata.stringVectors._M_t);
  if (im.metadata.colorSpace.set == true) {
    im.metadata.colorSpace.set = false;
  }
  if (im.metadata.MSE.set == true) {
    im.metadata.MSE.set = false;
  }
  if (im.metadata.samplesPerPixel.set == true) {
    im.metadata.samplesPerPixel.set = false;
  }
  if (im.metadata.fullResolution.set == true) {
    im.metadata.fullResolution.set = false;
  }
  if (im.metadata.pixelBounds.set == true) {
    im.metadata.pixelBounds.set = false;
  }
  if (im.metadata.NDCFromWorld.set == true) {
    im.metadata.NDCFromWorld.set = false;
  }
  if (im.metadata.cameraFromWorld.set == true) {
    im.metadata.cameraFromWorld.set = false;
  }
  if (im.metadata.renderTimeSeconds.set == true) {
    im.metadata.renderTimeSeconds.set = false;
  }
  im.image.p32.nStored = 0;
  (*(im.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (im.image.p32.alloc.memoryResource,im.image.p32.ptr,im.image.p32.nAlloc << 2,4);
  im.image.p16.nStored = 0;
  (*(im.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (im.image.p16.alloc.memoryResource,im.image.p16.ptr,im.image.p16.nAlloc * 2,2);
  im.image.p8.nStored = 0;
  (*(im.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (im.image.p8.alloc.memoryResource,im.image.p8.ptr,im.image.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&im.image.channelNames);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&refRead.metadata.stringVectors._M_t);
  if (refRead.metadata.colorSpace.set == true) {
    refRead.metadata.colorSpace.set = false;
  }
  if (refRead.metadata.MSE.set == true) {
    refRead.metadata.MSE.set = false;
  }
  if (refRead.metadata.samplesPerPixel.set == true) {
    refRead.metadata.samplesPerPixel.set = false;
  }
  if (refRead.metadata.fullResolution.set == true) {
    refRead.metadata.fullResolution.set = false;
  }
  if (refRead.metadata.pixelBounds.set == true) {
    refRead.metadata.pixelBounds.set = false;
  }
  if (refRead.metadata.NDCFromWorld.set == true) {
    refRead.metadata.NDCFromWorld.set = false;
  }
  if (refRead.metadata.cameraFromWorld.set == true) {
    refRead.metadata.cameraFromWorld.set = false;
  }
  if (refRead.metadata.renderTimeSeconds.set == true) {
    refRead.metadata.renderTimeSeconds.set = false;
  }
  refRead.image.p32.nStored = 0;
  (*(refRead.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (refRead.image.p32.alloc.memoryResource,refRead.image.p32.ptr,
             refRead.image.p32.nAlloc << 2,4);
  refRead.image.p16.nStored = 0;
  (*(refRead.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (refRead.image.p16.alloc.memoryResource,refRead.image.p16.ptr,
             refRead.image.p16.nAlloc * 2,2);
  refRead.image.p8.nStored = 0;
  (*(refRead.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (refRead.image.p8.alloc.memoryResource,refRead.image.p8.ptr,refRead.image.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&refRead.image.channelNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)metric._M_dataplus._M_p != &metric.field_2) {
    operator_delete(metric._M_dataplus._M_p,metric.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)referenceFile._M_dataplus._M_p != &referenceFile.field_2) {
    operator_delete(referenceFile._M_dataplus._M_p,
                    CONCAT71(referenceFile.field_2._M_allocated_capacity._1_7_,
                             referenceFile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)imageFile._M_dataplus._M_p != &imageFile.field_2) {
    operator_delete(imageFile._M_dataplus._M_p,
                    CONCAT71(imageFile.field_2._M_allocated_capacity._1_7_,
                             imageFile.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outFile._M_dataplus._M_p != &outFile.field_2) {
    operator_delete(outFile._M_dataplus._M_p,
                    CONCAT71(outFile.field_2._M_allocated_capacity._1_7_,
                             outFile.field_2._M_local_buf[0]) + 1);
  }
  return iVar10;
}

Assistant:

int diff(int argc, char *argv[]) {
    std::string outFile, imageFile, referenceFile, metric = "MSE";
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("diff", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (argv[0][0] == '-') {
            usage("diff", "%s: unknown command flag", *argv);
        } else if (!imageFile.empty()) {
            usage("diff", "%s: excess argument", *argv);
        } else {
            imageFile = *argv;
            ++argv;
        }
    }

    if (imageFile.empty())
        usage("diff", "must specify image to compute difference with.");

    if (referenceFile.empty())
        usage("diff", "must specify --reference image");

    if (metric != "L1" && metric != "MSE" && metric != "MRSE")
        usage("diff", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    ImageAndMetadata refRead = Image::Read(referenceFile);
    Image &refImage = refRead.image;
    const ImageMetadata &refMetadata = refRead.metadata;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        refImage = refImage.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    ImageAndMetadata im = Image::Read(imageFile);
    Image &image = im.image;

    // Crop before comparing resolutions.
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    if (image.Resolution() != refImage.Resolution()) {
        fprintf(stderr,
                "%s: image resolution (%d, %d) doesn't match reference (%d, %d)\n",
                imageFile.c_str(), image.Resolution().x, image.Resolution().y,
                refImage.Resolution().x, refImage.Resolution().y);
        return 1;
    }
    if (image.NChannels() != refImage.NChannels()) {
        fprintf(stderr, "%s: image channel count %d doesn't match reference %d.\n",
                imageFile.c_str(), image.NChannels(), refImage.NChannels());
        return 1;
    }

    if (image.ChannelNames() != refImage.ChannelNames()) {
        auto print = [](const std::vector<std::string> &n) {
            std::string s = n[0];
            for (size_t i = 1; i < n.size(); ++i) {
                s += ", ";
                s += n[i];
            }
            return s;
        };
        fprintf(stderr,
                "Warning: image channel names don't match: %s has \"%s\" "
                "but reference has \"%s\".\n",
                imageFile.c_str(), print(image.ChannelNames()).c_str(),
                print(refImage.ChannelNames()).c_str());
    }

    if (*im.metadata.GetColorSpace() != *refMetadata.GetColorSpace())
        fprintf(stderr, "Warning: computing difference of images with different "
                        "color spaces!");

    // Clamp Infs
    int nClamped = 0, nRefClamped = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            for (int c = 0; c < image.NChannels(); ++c) {
                if (std::isinf(image.GetChannel({x, y}, c))) {
                    ++nClamped;
                    image.SetChannel({x, y}, c, 0);
                }
                if (std::isinf(refImage.GetChannel({x, y}, c))) {
                    ++nRefClamped;
                    refImage.SetChannel({x, y}, c, 0);
                }
            }
    if (nClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", imageFile.c_str(),
                nClamped);
    if (nRefClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", referenceFile.c_str(),
                nRefClamped);

    Image diffImage;
    ImageChannelValues error(refImage.NChannels());
    if (metric == "L1")
        error = image.L1Error(image.AllChannelsDesc(), refImage, &diffImage);
    else if (metric == "MSE")
        error = image.MSE(image.AllChannelsDesc(), refImage, &diffImage);
    else
        error = image.MRSE(image.AllChannelsDesc(), refImage, &diffImage);

    if (error.MaxValue() == 0)
        // Same same.
        return 0;

    // Image averages
    Float refAverage = refImage.Average(refImage.AllChannelsDesc()).Average();
    Float imageAverage = image.Average(image.AllChannelsDesc()).Average();

    float delta = 100.f * (imageAverage - refAverage) / refAverage;
    std::string deltaString = StringPrintf("%f%% delta", delta);
    if (std::abs(delta) > 0.1)
        deltaString = Red(deltaString);
    else if (std::abs(delta) > 0.001)
        deltaString = Yellow(deltaString);
    Printf("Images differ:\n\t%s %s\n\tavg = %f / %f (%s), %s = %f\n", imageFile,
           referenceFile, imageAverage, refAverage, deltaString, metric, error.Average());

    if (!outFile.empty()) {
        if (!diffImage.Write(outFile))
            return 1;
    }

    return 1;
}